

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

void N_VDestroy_SensWrapper(N_Vector v)

{
  N_Vector v_00;
  undefined8 *__ptr;
  long *plVar1;
  long lVar2;
  
  if ((*(int *)((long)v->content + 0xc) == 1) && (plVar1 = (long *)v->content, 0 < (int)plVar1[1]))
  {
    lVar2 = 0;
    do {
      v_00 = *(N_Vector *)(*plVar1 + lVar2 * 8);
      if (v_00 != (N_Vector)0x0) {
        N_VDestroy(v_00);
      }
      *(undefined8 *)(*v->content + lVar2 * 8) = 0;
      lVar2 = lVar2 + 1;
      plVar1 = (long *)v->content;
    } while (lVar2 < (int)plVar1[1]);
  }
  free(*v->content);
  __ptr = (undefined8 *)v->content;
  *__ptr = 0;
  free(__ptr);
  v->content = (void *)0x0;
  free(v->ops);
  v->ops = (N_Vector_Ops)0x0;
  free(v);
  return;
}

Assistant:

void N_VDestroy_SensWrapper(N_Vector v)
{
  int i;

  if (NV_OWN_VECS_SW(v) == SUNTRUE) {
    for (i=0; i < NV_NVECS_SW(v); i++) {
      if (NV_VEC_SW(v,i)) N_VDestroy(NV_VEC_SW(v,i));
      NV_VEC_SW(v,i) = NULL;
    }
  }

  free(NV_VECS_SW(v)); NV_VECS_SW(v) = NULL;
  free(v->content); v->content = NULL;
  free(v->ops); v->ops = NULL;
  free(v); v = NULL;

  return;
}